

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_40e21::StringImportResolver::~StringImportResolver(StringImportResolver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ImportResolver)._vptr_ImportResolver =
       (_func_int **)&PTR__StringImportResolver_001a93b0;
  pcVar2 = (this->ccs)._M_dataplus._M_p;
  paVar1 = &(this->ccs).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit StringImportResolver(const std::string &ccs) : ccs(ccs) {}